

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void tio_set_html_expansion(uint html_char_val,char *expansion,size_t expansion_len)

{
  ulong uVar1;
  ulong uVar2;
  void *__dest;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (0x1caf < uVar2) {
      return;
    }
    uVar1 = uVar2 + 0x18;
  } while (*(uint *)((long)&amp_tbl[0].html_cval + uVar2) != html_char_val);
  __dest = malloc(expansion_len + 1);
  *(void **)((long)&amp_tbl[0].expan + uVar2) = __dest;
  memcpy(__dest,expansion,expansion_len);
  *(undefined1 *)((long)__dest + expansion_len) = 0;
  return;
}

Assistant:

void tio_set_html_expansion(unsigned int html_char_val,
                            const char *expansion, size_t expansion_len)
{
    struct amp_tbl_t *p;

    /* find the character value */
    for (p = amp_tbl ;
         p < amp_tbl + sizeof(amp_tbl)/sizeof(amp_tbl[0]) ; ++p)
    {
        /* if this is the one, store it */
        if (p->html_cval == html_char_val)
        {
            /* allocate space for it */
            p->expan = (char *)osmalloc(expansion_len + 1);

            /* save it */
            memcpy(p->expan, expansion, expansion_len);
            p->expan[expansion_len] = '\0';

            /* no need to look any further */
            return;
        }
    }
}